

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O1

void anon_unknown.dwarf_309ca6::checkSignature(uint32_t expected,uint8_t *in)

{
  uint32_t actual;
  SignatureError *this;
  
  actual = *(uint32_t *)in;
  if (actual == expected) {
    return;
  }
  this = (SignatureError *)__cxa_allocate_exception(0x30);
  Zip::SignatureError::SignatureError(this,expected,actual);
  __cxa_throw(this,&Zip::SignatureError::typeinfo,Zip::SignatureError::~SignatureError);
}

Assistant:

uint32_t fromLittleEndian(const uint8_t in[4]) {
  uint32_t out = 0;
  out |= in[0];
  out |= in[1] << 8;
  out |= in[2] << 16;
  out |= in[3] << 24;
  return out;
}